

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Double(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
         *this,double d)

{
  double *pdVar1;
  
  if ((long)(this->stack_).stackEnd_ - (long)(this->stack_).stackTop_ < 0x10) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (&this->stack_,1);
  }
  pdVar1 = (double *)(this->stack_).stackTop_;
  (this->stack_).stackTop_ = (char *)(pdVar1 + 2);
  *pdVar1 = 0.0;
  pdVar1[1] = 0.0;
  *pdVar1 = d;
  ((char *)((long)pdVar1 + 0xe))[0] = '\x16';
  ((char *)((long)pdVar1 + 0xe))[1] = '\x02';
  return true;
}

Assistant:

bool Double(double d) { new (stack_.template Push<ValueType>()) ValueType(d); return true; }